

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

FILE * uv__open_file(char *path)

{
  int __fd;
  FILE *fp;
  int fd;
  char *path_local;
  
  __fd = uv__open_cloexec(path,0);
  if (__fd < 0) {
    path_local = (char *)0x0;
  }
  else {
    path_local = (char *)fdopen(__fd,"r");
    if ((FILE *)path_local == (FILE *)0x0) {
      uv__close(__fd);
    }
  }
  return (FILE *)path_local;
}

Assistant:

FILE* uv__open_file(const char* path) {
  int fd;
  FILE* fp;

  fd = uv__open_cloexec(path, O_RDONLY);
  if (fd < 0)
    return NULL;

   fp = fdopen(fd, "r");
   if (fp == NULL)
     uv__close(fd);

   return fp;
}